

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_luma_vert
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  UWORD8 UVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  short sVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  
  lVar4 = (long)src_strd;
  uVar1 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar1 = 0;
  }
  if (ht < 1) {
    ht = 0;
  }
  pbVar7 = pu1_src + lVar4 * -3;
  for (iVar5 = 0; iVar5 != ht; iVar5 = iVar5 + 1) {
    pbVar10 = pbVar7;
    for (uVar11 = 0; uVar11 != uVar1; uVar11 = uVar11 + 1) {
      sVar6 = 0;
      pbVar9 = pbVar10;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        sVar6 = sVar6 + (ushort)*pbVar9 * (short)pi1_coeff[lVar8];
        pbVar9 = pbVar9 + lVar4;
      }
      iVar3 = sVar6 * 0x400 + 0x8000 >> 0x10;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      UVar2 = (UWORD8)iVar3;
      if (0xfe < iVar3) {
        UVar2 = 0xff;
      }
      pu1_dst[uVar11] = UVar2;
      pbVar10 = pbVar10 + 1;
    }
    pu1_dst = pu1_dst + dst_strd;
    pbVar7 = pbVar7 + lVar4;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert(UWORD8 *pu1_src,
                                UWORD8 *pu1_dst,
                                WORD32 src_strd,
                                WORD32 dst_strd,
                                WORD8 *pi1_coeff,
                                WORD32 ht,
                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3) * src_strd];

            i2_tmp = (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp = CLIP_U8(i2_tmp);

            pu1_dst[col] = (UWORD8)i2_tmp;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }

}